

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.h
# Opt level: O2

ProValueMap __thiscall ProValueMapStack::pop(ProValueMapStack *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_> *in_RSI;
  
  p_Var1 = (in_RSI->
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  p_Var2 = p_Var1[1]._M_next;
  p_Var1[1]._M_next = (_List_node_base *)0x0;
  (this->super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>).
  super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = p_Var2;
  std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
  pop_back(in_RSI);
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
            )this;
}

Assistant:

inline ProValueMap pop() { auto r = std::move(back()); pop_back(); return r; }